

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O3

void __thiscall Maze::Maze(Maze *this,string *inputFileName)

{
  ifstream *this_00;
  char cVar1;
  istream *piVar2;
  ulong uVar3;
  vector<char,_std::allocator<char>_> Row;
  string tempRow;
  void *local_a8;
  iterator iStack_a0;
  char *local_98;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_90;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *local_88;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *local_80;
  undefined1 *local_78;
  ulong local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  vector<bool,_std::allocator<bool>_> local_58;
  
  (this->pathStack).c.
  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->pathStack).c.
  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->pathStack).c.
  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->pathStack).c.
  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->pathStack).c.
  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->pathStack).c.
  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->pathStack).c.
  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->pathStack).c.
  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->pathStack).c.
  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->pathStack).c.
  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::_M_initialize_map
            ((_Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)this,0);
  local_80 = &this->MazeMatrix;
  local_88 = &this->solvedMatrix;
  local_90 = &this->used;
  this_00 = &this->MazeStream;
  (this->used).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->startCell).super__Tuple_impl<0UL,_int,_int> = (_Tuple_impl<0UL,_int,_int>)0x0;
  (this->used).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->used).
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solvedMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solvedMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MazeMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->solvedMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MazeMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MazeMatrix).
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endCell).super__Tuple_impl<0UL,_int,_int> = (_Tuple_impl<0UL,_int,_int>)0x0;
  std::ifstream::ifstream(this_00);
  std::ifstream::open((string *)this_00,(_Ios_Openmode)inputFileName);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Could not open file",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  else {
    local_78 = &local_68;
    local_70 = 0;
    local_68 = 0;
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)this_00,(string *)&local_78,cVar1);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      local_a8 = (void *)0x0;
      iStack_a0._M_current = (char *)0x0;
      local_98 = (char *)0x0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      if (local_70 != 0) {
        uVar3 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::push_back(&local_58,false);
          if (local_70 <= uVar3) {
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
          }
          if (iStack_a0._M_current == local_98) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&local_a8,iStack_a0,local_78 + uVar3);
          }
          else {
            *iStack_a0._M_current = local_78[uVar3];
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < local_70);
      }
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::push_back(local_80,(value_type *)&local_a8);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::push_back(local_88,(value_type *)&local_a8);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::push_back(local_90,&local_58);
      if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_a8 != (void *)0x0) {
        operator_delete(local_a8,(long)local_98 - (long)local_a8);
      }
    }
    this->isSolved = false;
    std::ifstream::close();
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
  }
  return;
}

Assistant:

Maze::Maze(std::string inputFileName) {
    //constructs the maze, and the solved mazed.
    MazeStream.open(inputFileName);
    if (!MazeStream.is_open())  {
        std::cout<< "Could not open file" << std::endl;
        return;
    }
    std::string tempRow;
    while (getline(MazeStream, tempRow)){
        std::vector<char> Row;
        std::vector<bool> usedRow;
        for(int i = 0; i<tempRow.size(); i++)
        {
            usedRow.push_back(false);
            Row.push_back(tempRow.at(i));
        }
        MazeMatrix.push_back(Row);
        //the solution
        solvedMatrix.push_back(Row);
        used.push_back(usedRow);
    }
    isSolved = false;
    MazeStream.close();
}